

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O0

void h2o_hostinfo_getaddr_receiver(h2o_multithread_receiver_t *receiver,h2o_linklist_t *messages)

{
  h2o_linklist_t *node;
  st_h2o_linklist_t *psVar1;
  int iVar2;
  h2o_hostinfo_getaddr_cb cb;
  h2o_hostinfo_getaddr_req_t *req;
  h2o_linklist_t *messages_local;
  h2o_multithread_receiver_t *receiver_local;
  
  while( true ) {
    iVar2 = h2o_linklist_is_empty(messages);
    if (iVar2 != 0) break;
    node = messages->next;
    h2o_linklist_unlink(node);
    psVar1 = node[-2].next;
    if (psVar1 != (st_h2o_linklist_t *)0x0) {
      node[-2].next = (st_h2o_linklist_t *)0x0;
      (*(code *)psVar1)(&node[-3].prev,node[1].next,node[1].prev,node[-2].prev);
    }
    if (node[1].prev != (st_h2o_linklist_t *)0x0) {
      freeaddrinfo((addrinfo *)node[1].prev);
    }
    free(&node[-3].prev);
  }
  return;
}

Assistant:

void h2o_hostinfo_getaddr_receiver(h2o_multithread_receiver_t *receiver, h2o_linklist_t *messages)
{
    while (!h2o_linklist_is_empty(messages)) {
        h2o_hostinfo_getaddr_req_t *req = H2O_STRUCT_FROM_MEMBER(h2o_hostinfo_getaddr_req_t, _out.message.link, messages->next);
        h2o_linklist_unlink(&req->_out.message.link);
        h2o_hostinfo_getaddr_cb cb = req->_cb;
        if (cb != NULL) {
            req->_cb = NULL;
            cb(req, req->_out.errstr, req->_out.ai, req->cbdata);
        }
        if (req->_out.ai != NULL)
            freeaddrinfo(req->_out.ai);
        free(req);
    }
}